

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

void __thiscall Quat4f::Quat4f(Quat4f *this,Vector3f *v)

{
  float *pfVar1;
  Vector3f *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  pfVar1 = Vector3f::operator[](in_RSI,0);
  in_RDI[1] = *pfVar1;
  pfVar1 = Vector3f::operator[](in_RSI,1);
  in_RDI[2] = *pfVar1;
  pfVar1 = Vector3f::operator[](in_RSI,2);
  in_RDI[3] = *pfVar1;
  return;
}

Assistant:

Quat4f::Quat4f( const Vector3f& v )
{
	m_elements[ 0 ] = 0;
	m_elements[ 1 ] = v[ 0 ];
	m_elements[ 2 ] = v[ 1 ];
	m_elements[ 3 ] = v[ 2 ];
}